

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

void __thiscall
cinject::ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>::
addRegistration<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IRunner>
          (ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird> *this,
          shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
          *instanceStorage)

{
  long lVar1;
  vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
  *this_00;
  CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
  *this_01;
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> local_98;
  shared_ptr<cinject::IInstanceRetriever> local_88 [2];
  allocator local_61;
  string local_60 [32];
  component_type local_40;
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> *local_18;
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
  *instanceStorage_local;
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird> *this_local;
  
  lVar1 = *(long *)this;
  local_18 = instanceStorage;
  instanceStorage_local =
       (shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  make_component_type<IRunner>(&local_40,(string *)local_60);
  this_00 = (vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
             *)std::
               unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
               ::operator[]((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                             *)(lVar1 + 8),&local_40);
  this_01 = (CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
             *)operator_new(0x18);
  std::shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  shared_ptr(&local_98,instanceStorage);
  CastInstanceRetriever<Bird,_IRunner,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
  ::CastInstanceRetriever(this_01,&local_98);
  std::shared_ptr<cinject::IInstanceRetriever>::
  shared_ptr<cinject::CastInstanceRetriever<Bird,IRunner,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>>,void>
            (local_88,this_01);
  std::
  vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
  ::emplace_back<std::shared_ptr<cinject::IInstanceRetriever>>(this_00,local_88);
  std::shared_ptr<cinject::IInstanceRetriever>::~shared_ptr(local_88);
  std::shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  ~shared_ptr(&local_98);
  component_type::~component_type(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void addRegistration(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        static_assert(std::is_convertible<TImplementation*, TComponent*>::value, "No conversion exists from TImplementation* to TComponent*");

        container_->registrations_[make_component_type<TComponent>()]
            .emplace_back(std::shared_ptr<IInstanceRetriever>(new CastInstanceRetriever<TImplementation, TComponent, TInstanceStorage>(instanceStorage)));
    }